

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

vector<duckdb::MemoryInformation,_true> * __thiscall
duckdb::StandardBufferManager::GetMemoryUsageInfo
          (vector<duckdb::MemoryInformation,_true> *__return_storage_ptr__,
          StandardBufferManager *this)

{
  idx_t k;
  long lVar1;
  MemoryInformation info;
  value_type local_38;
  
  (__return_storage_ptr__->
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>).
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>).
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>).
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar1 = 0; lVar1 != 0xe; lVar1 = lVar1 + 1) {
    local_38.tag = (MemoryTag)lVar1;
    local_38.size =
         BufferPool::MemoryUsage::GetUsedMemory(&this->buffer_pool->memory_usage,local_38.tag,FLUSH)
    ;
    local_38.evicted_data =
         this->evicted_data_per_tag[lVar1].super___atomic_base<unsigned_long>._M_i;
    ::std::vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>::push_back
              (&__return_storage_ptr__->
                super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>,
               &local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MemoryInformation> StandardBufferManager::GetMemoryUsageInfo() const {
	vector<MemoryInformation> result;
	for (idx_t k = 0; k < MEMORY_TAG_COUNT; k++) {
		MemoryInformation info;
		info.tag = MemoryTag(k);
		info.size = buffer_pool.memory_usage.GetUsedMemory(MemoryTag(k), BufferPool::MemoryUsageCaches::FLUSH);
		info.evicted_data = evicted_data_per_tag[k].load();
		result.push_back(info);
	}
	return result;
}